

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pooling3d.cpp
# Opt level: O0

void __thiscall
ncnn::Pooling3D::make_padding
          (Pooling3D *this,Mat *bottom_blob,Mat *bottom_blob_bordered,Option *opt)

{
  void *in_RCX;
  long in_RSI;
  Mat *in_RDI;
  Option opt_b_3;
  int dpad_1;
  int hpad_1;
  int wpad_1;
  Option opt_b_2;
  int dpad;
  int hpad;
  int wpad;
  Option opt_b_1;
  Option opt_b;
  int dtail;
  int htail;
  int wtail;
  int dtailpad;
  int htailpad;
  int wtailpad;
  float pad_value;
  int d;
  int h;
  int w;
  undefined4 in_stack_fffffffffffffe40;
  undefined4 in_stack_fffffffffffffe44;
  undefined4 in_stack_fffffffffffffe48;
  undefined4 in_stack_fffffffffffffe4c;
  float in_stack_fffffffffffffe74;
  float v;
  int in_stack_fffffffffffffe78;
  int right;
  int in_stack_fffffffffffffe7c;
  int left;
  int in_stack_fffffffffffffe80;
  int in_stack_fffffffffffffe84;
  Mat *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffea0;
  int in_stack_fffffffffffffea8;
  int in_stack_fffffffffffffeb0;
  Option *in_stack_fffffffffffffeb8;
  undefined1 local_120 [8];
  undefined8 local_118;
  int local_dc;
  int local_d8;
  int local_d4;
  undefined1 local_d0 [8];
  undefined8 local_c8;
  undefined1 local_90 [8];
  undefined8 local_88;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  void *local_28;
  long local_18;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_34 = *(int *)(in_RSI + 0x34);
  local_28 = in_RCX;
  local_18 = in_RSI;
  ncnn::Mat::operator=
            ((Mat *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
             (Mat *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  if ((int)in_RDI[2].cstep == 0) {
    in_stack_fffffffffffffe80 = -0x800001;
    in_stack_fffffffffffffe84 = -0x3d000000;
    local_38 = in_stack_fffffffffffffe84;
    if (*(long *)(local_18 + 0x10) != 1) {
      in_stack_fffffffffffffe84 = -0x800001;
      local_38 = in_stack_fffffffffffffe84;
    }
  }
  else {
    local_38 = 0;
  }
  local_3c = 0;
  local_40 = 0;
  local_44 = 0;
  if (in_RDI[3].h == 0) {
    local_48 = ((local_2c + *(int *)((long)&in_RDI[3].elemsize + 4) + in_RDI[3].elempack) -
               *(int *)((long)&in_RDI[2].cstep + 4)) % *(int *)&in_RDI[3].refcount;
    local_4c = ((local_30 + *(int *)&in_RDI[3].field_0x1c + *(int *)&in_RDI[3].allocator) -
               *(int *)&in_RDI[3].data) % *(int *)((long)&in_RDI[3].refcount + 4);
    local_50 = ((local_34 + *(int *)((long)&in_RDI[3].allocator + 4) + in_RDI[3].dims) -
               *(int *)((long)&in_RDI[3].data + 4)) % (int)in_RDI[3].elemsize;
    if (local_48 != 0) {
      local_3c = *(int *)&in_RDI[3].refcount - local_48;
    }
    if (local_4c != 0) {
      local_40 = *(int *)((long)&in_RDI[3].refcount + 4) - local_4c;
    }
    if (local_50 != 0) {
      local_44 = (int)in_RDI[3].elemsize - local_50;
    }
    memcpy(local_90,local_28,0x40);
    local_88 = *(undefined8 *)((long)local_28 + 0x10);
    copy_make_border_3d(in_stack_fffffffffffffe90,in_RDI,in_stack_fffffffffffffe84,
                        in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                        in_stack_fffffffffffffe78,in_stack_fffffffffffffea0,
                        in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffe74,in_stack_fffffffffffffeb8);
  }
  else if (in_RDI[3].h == 1) {
    memcpy(local_d0,local_28,0x40);
    local_c8 = *(undefined8 *)((long)local_28 + 0x10);
    copy_make_border_3d(in_stack_fffffffffffffe90,in_RDI,in_stack_fffffffffffffe84,
                        in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                        in_stack_fffffffffffffe78,in_stack_fffffffffffffea0,
                        in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                        in_stack_fffffffffffffe74,in_stack_fffffffffffffeb8);
  }
  else if (in_RDI[3].h == 2) {
    v = *(float *)((long)&in_RDI[2].cstep + 4);
    local_d4 = ((int)v + ((local_2c + -1) / *(int *)&in_RDI[3].refcount) *
                         *(int *)&in_RDI[3].refcount) - local_2c;
    right = *(int *)&in_RDI[3].data;
    local_d8 = (right + ((local_30 + -1) / *(int *)((long)&in_RDI[3].refcount + 4)) *
                        *(int *)((long)&in_RDI[3].refcount + 4)) - local_30;
    left = *(int *)((long)&in_RDI[3].data + 4);
    local_dc = (left + ((local_34 + -1) / (int)in_RDI[3].elemsize) * (int)in_RDI[3].elemsize) -
               local_34;
    if (((0 < local_d4) || (0 < local_d8)) || (0 < local_dc)) {
      memcpy(local_120,local_28,0x40);
      local_118 = *(undefined8 *)((long)local_28 + 0x10);
      copy_make_border_3d(in_stack_fffffffffffffe90,in_RDI,in_stack_fffffffffffffe84,
                          in_stack_fffffffffffffe80,left,right,in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,v,
                          in_stack_fffffffffffffeb8);
    }
  }
  else if (in_RDI[3].h == 3) {
    if (((0 < (*(int *)((long)&in_RDI[2].cstep + 4) +
              ((local_2c + -1) / *(int *)&in_RDI[3].refcount) * *(int *)&in_RDI[3].refcount) -
              local_2c) ||
        (0 < (*(int *)&in_RDI[3].data +
             ((local_30 + -1) / *(int *)((long)&in_RDI[3].refcount + 4)) *
             *(int *)((long)&in_RDI[3].refcount + 4)) - local_30)) ||
       (0 < (*(int *)((long)&in_RDI[3].data + 4) +
            ((local_34 + -1) / (int)in_RDI[3].elemsize) * (int)in_RDI[3].elemsize) - local_34)) {
      memcpy(&stack0xfffffffffffffe90,local_28,0x40);
      copy_make_border_3d(in_stack_fffffffffffffe90,in_RDI,in_stack_fffffffffffffe84,
                          in_stack_fffffffffffffe80,in_stack_fffffffffffffe7c,
                          in_stack_fffffffffffffe78,in_stack_fffffffffffffea0,
                          in_stack_fffffffffffffea8,in_stack_fffffffffffffeb0,
                          in_stack_fffffffffffffe74,in_stack_fffffffffffffeb8);
    }
  }
  return;
}

Assistant:

void Pooling3D::make_padding(const Mat& bottom_blob, Mat& bottom_blob_bordered, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int d = bottom_blob.d;

    bottom_blob_bordered = bottom_blob;

    float pad_value = 0.f;
    if (pooling_type == PoolMethod_MAX)
    {
        pad_value = bottom_blob.elemsize == 1 ? -128.f : -FLT_MAX;
    }
    else if (pooling_type == PoolMethod_AVE)
    {
        pad_value = 0.f;
    }

    int wtailpad = 0;
    int htailpad = 0;
    int dtailpad = 0;

    if (pad_mode == 0) // full padding
    {
        int wtail = (w + pad_left + pad_right - kernel_w) % stride_w;
        int htail = (h + pad_top + pad_bottom - kernel_h) % stride_h;
        int dtail = (d + pad_front + pad_behind - kernel_d) % stride_d;
        if (wtail != 0)
            wtailpad = stride_w - wtail;
        if (htail != 0)
            htailpad = stride_h - htail;
        if (dtail != 0)
            dtailpad = stride_d - dtail;

        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border_3d(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom + htailpad, pad_left, pad_right + wtailpad, pad_front, pad_behind + dtailpad, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 1) // valid padding
    {
        Option opt_b = opt;
        opt_b.blob_allocator = opt.workspace_allocator;
        copy_make_border_3d(bottom_blob, bottom_blob_bordered, pad_top, pad_bottom, pad_left, pad_right, pad_front, pad_behind, BORDER_CONSTANT, pad_value, opt_b);
    }
    else if (pad_mode == 2) // tensorflow padding=SAME or onnx padding=SAME_UPPER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        int dpad = kernel_d + (d - 1) / stride_d * stride_d - d;
        if (wpad > 0 || hpad > 0 || dpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border_3d(bottom_blob, bottom_blob_bordered, hpad / 2, hpad - hpad / 2, wpad / 2, wpad - wpad / 2, dpad / 2, dpad - dpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
    else if (pad_mode == 3) // onnx padding=SAME_LOWER
    {
        int wpad = kernel_w + (w - 1) / stride_w * stride_w - w;
        int hpad = kernel_h + (h - 1) / stride_h * stride_h - h;
        int dpad = kernel_d + (d - 1) / stride_d * stride_d - d;
        if (wpad > 0 || hpad > 0 || dpad > 0)
        {
            Option opt_b = opt;
            opt_b.blob_allocator = opt.workspace_allocator;
            copy_make_border_3d(bottom_blob, bottom_blob_bordered, hpad - hpad / 2, hpad / 2, wpad - wpad / 2, wpad / 2, dpad / 2, dpad - dpad / 2, BORDER_CONSTANT, pad_value, opt_b);
        }
    }
}